

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

void * assetsys_internal_mz_realloc(void *memctx,void *ptr,size_t items,size_t size)

{
  ulong __n;
  long *plVar1;
  unsigned_long_long *new_ptr;
  unsigned_long_long prev_size;
  unsigned_long_long *p;
  size_t size_local;
  size_t items_local;
  void *ptr_local;
  void *memctx_local;
  
  if (ptr == (void *)0x0) {
    memctx_local = assetsys_internal_mz_alloc(memctx,items,size);
  }
  else {
    __n = *(ulong *)((long)ptr + -8);
    memctx_local = ptr;
    if (__n < items * size) {
      plVar1 = (long *)malloc(items * size + 8);
      *plVar1 = items * size;
      memctx_local = plVar1 + 1;
      memcpy(memctx_local,ptr,__n);
      free((ulong *)((long)ptr + -8));
    }
  }
  return memctx_local;
}

Assistant:

static void* assetsys_internal_mz_realloc( void* memctx, void* ptr, size_t items, size_t size ) 
    { 
    (void) memctx; (void) ptr; (void) items; (void) size; 
    if( !ptr ) return assetsys_internal_mz_alloc( memctx, items, size );
   
    ASSETSYS_U64* p = ( (ASSETSYS_U64*) ptr ) - 1;
    ASSETSYS_U64 prev_size = *p;
    if( prev_size >= ( items * size ) ) return ptr;
    
    ASSETSYS_U64* new_ptr = (ASSETSYS_U64*) ASSETSYS_MALLOC( memctx, ( items * size ) + sizeof( ASSETSYS_U64 ) ); 
    *new_ptr = ( items * size );
    ++new_ptr;
    memcpy( new_ptr, ptr, (size_t) prev_size );
    ASSETSYS_FREE( memctx, p );
    return new_ptr;
    }